

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
LINSimulationDataGenerator::CreateSerialByte(LINSimulationDataGenerator *this,U8 byte)

{
  int iVar1;
  uint local_20;
  byte local_19;
  U32 i;
  U8 mask;
  U32 samples_per_bit;
  U8 byte_local;
  LINSimulationDataGenerator *this_local;
  
  mask = byte;
  _samples_per_bit = this;
  LINChecksum::add(&this->mChecksum,byte);
  SwapEnds(this,&mask);
  iVar1 = (int)this;
  SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x10);
  SimulationChannelDescriptor::Advance(iVar1 + 0x10);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(iVar1 + 0x10);
  local_19 = 0x80;
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    if ((mask & local_19) == 0) {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x10);
    }
    else {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x10);
    }
    SimulationChannelDescriptor::Advance(iVar1 + 0x10);
    local_19 = (byte)((int)(uint)local_19 >> 1);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x10);
  SimulationChannelDescriptor::Advance(iVar1 + 0x10);
  return;
}

Assistant:

void LINSimulationDataGenerator::CreateSerialByte( U8 byte )
{
    U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;

    mChecksum.add( byte );
    SwapEnds( byte );

    // inter-byte space.....
    mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
    mSerialSimulationData.Advance( samples_per_bit * 2 );

    // start bit...
    mSerialSimulationData.Transition();               // low-going edge for start bit
    mSerialSimulationData.Advance( samples_per_bit ); // add start bit time

    U8 mask = 0x1 << 7;
    for( U32 i = 0; i < 8; i++ )
    {
        if( ( byte & mask ) != 0 )
            mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
        else
            mSerialSimulationData.TransitionIfNeeded( BIT_LOW );

        mSerialSimulationData.Advance( samples_per_bit );
        mask = mask >> 1;
    }

    // stop bit...
    mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
    mSerialSimulationData.Advance( samples_per_bit * 2 );
}